

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deflate.cpp
# Opt level: O1

void __thiscall DeflateDecoder::run(DeflateDecoder *this)

{
  pointer pcVar1;
  Lz77Decoder lz77;
  HuffmanDecoder huffman;
  string local_110;
  undefined1 local_f0 [40];
  _Alloc_hider local_c8;
  size_type local_c0;
  long *local_a0 [2];
  long local_90 [2];
  HuffmanDecoder local_80;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Deflate decryption...",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  pcVar1 = (this->super_Cryptor).in_message_._M_dataplus._M_p;
  local_f0._0_8_ = local_f0 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f0,pcVar1,pcVar1 + (this->super_Cryptor).in_message_._M_string_length);
  HuffmanDecoder::HuffmanDecoder(&local_80,(string *)local_f0);
  if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  HuffmanDecoder::run(&local_80);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,local_80.super_Cryptor.out_message_._M_dataplus._M_p,
             local_80.super_Cryptor.out_message_._M_dataplus._M_p +
             local_80.super_Cryptor.out_message_._M_string_length);
  Lz77Decoder::Lz77Decoder((Lz77Decoder *)local_f0,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  Lz77Decoder::run((Lz77Decoder *)local_f0);
  local_a0[0] = local_90;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a0,local_c8._M_p,local_c8._M_p + local_c0);
  std::__cxx11::string::operator=((string *)&(this->super_Cryptor).out_message_,(string *)local_a0);
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0],local_90[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"decryption done",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  Cryptor::~Cryptor((Cryptor *)local_f0);
  std::__cxx11::
  _List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>::_M_clear
            (&local_80.nodes_.
              super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
            );
  Cryptor::~Cryptor(&local_80.super_Cryptor);
  return;
}

Assistant:

void DeflateDecoder::run() {
  cout << "Deflate decryption..." << endl;

  HuffmanDecoder huffman(get_in_message());
  huffman.run();
  Lz77Decoder lz77(huffman.get_out_message());
  lz77.run();
  set_out_message(lz77.get_out_message());

  cout << "decryption done" << endl;
}